

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# menu.cpp
# Opt level: O0

bool __thiscall DMenu::MenuEvent(DMenu *this,int mkey,bool fromcontroller)

{
  char *name;
  float volume;
  FSoundID local_24;
  undefined1 local_1d;
  int local_1c;
  bool fromcontroller_local;
  DMenu *pDStack_18;
  int mkey_local;
  DMenu *this_local;
  
  if (mkey == 7) {
    local_1d = fromcontroller;
    local_1c = mkey;
    pDStack_18 = this;
    (*(this->super_DObject)._vptr_DObject[0xd])();
    name = "menu/clear";
    if (CurrentMenu != (DMenu *)0x0) {
      name = "menu/backup";
    }
    FSoundID::FSoundID(&local_24,name);
    volume = FFloatCVar::operator_cast_to_float(&snd_menuvolume);
    S_Sound(0x22,&local_24,volume,0.0);
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool DMenu::MenuEvent (int mkey, bool fromcontroller)
{
	switch (mkey)
	{
	case MKEY_Back:
	{
		Close();
		S_Sound (CHAN_VOICE | CHAN_UI, 
			DMenu::CurrentMenu != NULL? "menu/backup" : "menu/clear", snd_menuvolume, ATTN_NONE);
		return true;
	}
	}
	return false;
}